

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viface.cpp
# Opt level: O2

void __thiscall viface::VIfaceImpl::setIPv4Broadcast(VIfaceImpl *this,string *broadcast)

{
  int iVar1;
  ostream *poVar2;
  invalid_argument *this_00;
  in_addr addr;
  string local_1b8 [32];
  ostringstream what;
  
  iVar1 = inet_pton(2,(broadcast->_M_dataplus)._M_p,&addr);
  if (iVar1 != 0) {
    std::__cxx11::string::_M_assign((string *)&this->broadcast);
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&what);
  poVar2 = std::operator<<((ostream *)&what,"--- Invalid IPv4 address (");
  poVar2 = std::operator<<(poVar2,(string *)broadcast);
  std::operator<<(poVar2,") for ");
  poVar2 = std::operator<<((ostream *)&what,(string *)&this->name);
  poVar2 = std::operator<<(poVar2,".");
  std::endl<char,std::char_traits<char>>(poVar2);
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::invalid_argument::invalid_argument(this_00,local_1b8);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void VIfaceImpl::setIPv4Broadcast(string broadcast)
{
    // Validate format
    struct in_addr addr;

    if (!inet_pton(AF_INET, broadcast.c_str(), &addr)) {
        ostringstream what;
        what << "--- Invalid IPv4 address (" << broadcast << ") for ";
        what << this->name << "." << endl;
        throw invalid_argument(what.str());
    }

    this->broadcast = broadcast;
    return;
}